

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.hpp
# Opt level: O2

void * __thiscall cppjit::builder::builder::load_kernel(builder *this)

{
  void *pvVar1;
  long lVar2;
  char *pcVar3;
  cppjit_exception *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string library_file;
  stringstream s;
  ostream local_190 [376];
  
  if (this->kernel_library != (void *)0x0) {
    dlclose();
    this->kernel_library = (void *)0x0;
  }
  std::operator+(&local_1e0,&this->compile_dir,"lib");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s,&local_1e0,
                 &this->kernel_name);
  std::operator+(&library_file,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s,".so");
  std::__cxx11::string::~string((string *)&s);
  std::__cxx11::string::~string((string *)&local_1e0);
  dlerror();
  pvVar1 = (void *)dlopen(library_file._M_dataplus._M_p,1);
  this->kernel_library = pvVar1;
  lVar2 = dlerror();
  if (lVar2 == 0) {
    dlerror();
    pvVar1 = (void *)dlsym(this->kernel_library,(this->kernel_name)._M_dataplus._M_p);
    pcVar3 = (char *)dlerror();
    if (pcVar3 == (char *)0x0) {
      std::__cxx11::string::~string((string *)&library_file);
      return pvVar1;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&s);
    std::operator<<(local_190,"error: could not find kernel symbol, reason: ");
    std::operator<<(local_190,pcVar3);
    pcVar4 = (cppjit_exception *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    cppjit_exception::cppjit_exception(pcVar4,&local_1e0);
    __cxa_throw(pcVar4,&cppjit_exception::typeinfo,cppjit_exception::~cppjit_exception);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&s);
  std::operator<<(local_190,"error: could not open kernel shared library file, reason: ");
  pcVar3 = (char *)dlerror();
  std::operator<<(local_190,pcVar3);
  pcVar4 = (cppjit_exception *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  cppjit_exception::cppjit_exception(pcVar4,&local_1e0);
  __cxa_throw(pcVar4,&cppjit_exception::typeinfo,cppjit_exception::~cppjit_exception);
}

Assistant:

void *load_kernel() {
    if (kernel_library) {
      dlclose(kernel_library);
      kernel_library = nullptr;
    }

    std::string library_file(compile_dir + "lib" + kernel_name + ".so");

    dlerror();  // clear any prior error
    kernel_library = dlopen(library_file.c_str(), RTLD_LAZY);
    char *error = dlerror();

    if (error != nullptr) {
      std::stringstream s;
      s << "error: could not open kernel shared library file, reason: ";
      s << dlerror();
      throw cppjit_exception(s.str());
    }

    dlerror();  // clear any prior error
    void *uncasted_function = dlsym(kernel_library, kernel_name.c_str());
    error = dlerror();

    if (error != nullptr) {
      std::stringstream s;
      s << "error: could not find kernel symbol, reason: ";
      s << error;
      throw cppjit_exception(s.str());
    }
    return uncasted_function;
  }